

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cutMan.c
# Opt level: O0

Cut_Man_t * Cut_ManStart(Cut_Params_t *pParams)

{
  int iVar1;
  Cut_Man_t *__s;
  Vec_Ptr_t *pVVar2;
  uint *puVar3;
  Vec_Int_t *pVVar4;
  Extra_MmFixed_t *pEVar5;
  Cut_Man_t *p;
  Cut_Params_t *pParams_local;
  
  if ((2 < pParams->nVarsMax) && (pParams->nVarsMax < 0xd)) {
    __s = (Cut_Man_t *)malloc(0x140);
    memset(__s,0,0x140);
    __s->pParams = pParams;
    pVVar2 = Vec_PtrAlloc(pParams->nIdsMax);
    __s->vCutsNew = pVVar2;
    Vec_PtrFill(__s->vCutsNew,pParams->nIdsMax,(void *)0x0);
    if (pParams->fSeq != 0) {
      __s->pParams->fFilter = 1;
      pVVar2 = Vec_PtrAlloc(pParams->nIdsMax);
      __s->vCutsOld = pVVar2;
      Vec_PtrFill(__s->vCutsOld,pParams->nIdsMax,(void *)0x0);
      pVVar2 = Vec_PtrAlloc(pParams->nCutSet);
      __s->vCutsTemp = pVVar2;
      Vec_PtrFill(__s->vCutsTemp,pParams->nCutSet,(void *)0x0);
      if ((pParams->fTruth != 0) && (5 < pParams->nVarsMax)) {
        pParams->fTruth = 0;
        printf("Skipping computation of truth tables for sequential cuts with more than 5 inputs.\n"
              );
      }
    }
    __s->EntrySize = pParams->nVarsMax * 4 + 0x18;
    if (pParams->fTruth != 0) {
      if (pParams->nVarsMax < 0xf) {
        iVar1 = Cut_TruthWords(pParams->nVarsMax);
        __s->nTruthWords = iVar1;
        __s->EntrySize = __s->EntrySize + __s->nTruthWords * 4;
      }
      else {
        pParams->fTruth = 0;
        printf("Skipping computation of truth table for more than %d inputs.\n",0xe);
      }
      puVar3 = (uint *)malloc((long)(__s->nTruthWords << 2) << 2);
      __s->puTemp[0] = puVar3;
      __s->puTemp[1] = __s->puTemp[0] + __s->nTruthWords;
      __s->puTemp[2] = __s->puTemp[1] + __s->nTruthWords;
      __s->puTemp[3] = __s->puTemp[2] + __s->nTruthWords;
    }
    if (pParams->fRecord != 0) {
      pVVar4 = Vec_IntStart(pParams->nIdsMax);
      __s->vNodeCuts = pVVar4;
      pVVar4 = Vec_IntStart(pParams->nIdsMax);
      __s->vNodeStarts = pVVar4;
      pVVar4 = Vec_IntAlloc(0);
      __s->vCutPairs = pVVar4;
    }
    if ((pParams->fMap != 0) && (__s->pParams->fSeq == 0)) {
      pVVar4 = Vec_IntStart(pParams->nIdsMax);
      __s->vDelays = pVVar4;
      pVVar4 = Vec_IntStart(pParams->nIdsMax);
      __s->vDelays2 = pVVar4;
      pVVar2 = Vec_PtrStart(pParams->nIdsMax);
      __s->vCutsMax = pVVar2;
    }
    pEVar5 = Extra_MmFixedStart(__s->EntrySize);
    __s->pMmCuts = pEVar5;
    pVVar2 = Vec_PtrAlloc(100);
    __s->vTemp = pVVar2;
    return __s;
  }
  __assert_fail("pParams->nVarsMax >= 3 && pParams->nVarsMax <= CUT_SIZE_MAX",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/cut/cutMan.c"
                ,0x34,"Cut_Man_t *Cut_ManStart(Cut_Params_t *)");
}

Assistant:

Cut_Man_t * Cut_ManStart( Cut_Params_t * pParams )
{
    Cut_Man_t * p;
//    extern int nTruthDsd;
//    nTruthDsd = 0;
    assert( pParams->nVarsMax >= 3 && pParams->nVarsMax <= CUT_SIZE_MAX );
    p = ABC_ALLOC( Cut_Man_t, 1 );
    memset( p, 0, sizeof(Cut_Man_t) );
    // set and correct parameters
    p->pParams = pParams;
    // prepare storage for cuts
    p->vCutsNew = Vec_PtrAlloc( pParams->nIdsMax );
    Vec_PtrFill( p->vCutsNew, pParams->nIdsMax, NULL );
    // prepare storage for sequential cuts
    if ( pParams->fSeq )
    {
        p->pParams->fFilter = 1;
        p->vCutsOld = Vec_PtrAlloc( pParams->nIdsMax );
        Vec_PtrFill( p->vCutsOld, pParams->nIdsMax, NULL );
        p->vCutsTemp = Vec_PtrAlloc( pParams->nCutSet );
        Vec_PtrFill( p->vCutsTemp, pParams->nCutSet, NULL );
        if ( pParams->fTruth && pParams->nVarsMax > 5 )
        {
            pParams->fTruth = 0;
            printf( "Skipping computation of truth tables for sequential cuts with more than 5 inputs.\n" );
        }
    }
    // entry size
    p->EntrySize = sizeof(Cut_Cut_t) + pParams->nVarsMax * sizeof(int);
    if ( pParams->fTruth )
    {
        if ( pParams->nVarsMax > 14 )
        {
            pParams->fTruth = 0;
            printf( "Skipping computation of truth table for more than %d inputs.\n", 14 );
        }
        else
        {
            p->nTruthWords = Cut_TruthWords( pParams->nVarsMax );
            p->EntrySize += p->nTruthWords * sizeof(unsigned);
        }
        p->puTemp[0] = ABC_ALLOC( unsigned, 4 * p->nTruthWords );
        p->puTemp[1] = p->puTemp[0] + p->nTruthWords;
        p->puTemp[2] = p->puTemp[1] + p->nTruthWords;
        p->puTemp[3] = p->puTemp[2] + p->nTruthWords;
    }
    // enable cut computation recording
    if ( pParams->fRecord )
    {
        p->vNodeCuts   = Vec_IntStart( pParams->nIdsMax );
        p->vNodeStarts = Vec_IntStart( pParams->nIdsMax );
        p->vCutPairs   = Vec_IntAlloc( 0 );
    }
    // allocate storage for delays
    if ( pParams->fMap && !p->pParams->fSeq )
    {
        p->vDelays = Vec_IntStart( pParams->nIdsMax );
        p->vDelays2 = Vec_IntStart( pParams->nIdsMax );
        p->vCutsMax = Vec_PtrStart( pParams->nIdsMax );
    }
    // memory for cuts
    p->pMmCuts = Extra_MmFixedStart( p->EntrySize );
    p->vTemp = Vec_PtrAlloc( 100 );
    return p;
}